

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O3

void Llb_BddSetDefaultParams(Gia_ParLlb_t *p)

{
  p->nPartValue = 0;
  p->fBackward = 0;
  p->fReorder = 0;
  p->fIndConstr = 0;
  p->fVerbose = 0;
  p->fVeryVerbose = 0;
  p->fSilent = 0;
  p->fSkipReach = 0;
  p->fSkipOutCheck = 0;
  p->TimeLimit = 0;
  *(undefined8 *)&p->TimeLimitGlo = 0;
  p->TimeTarget = 0;
  *(undefined8 *)&p->iFrame = 0;
  p->fUsePivots = 0;
  p->fCluster = 0;
  p->fSchedule = 0;
  p->fDumpReached = 0;
  p->nBddMax = 1000000;
  p->nIterMax = 10000000;
  p->nClusterMax = 0x14;
  p->nHintDepth = 0;
  p->HintFirst = 0;
  p->fUseFlow = 0;
  p->nVolumeMax = 100;
  p->nVolumeMin = 0x1e;
  p->fReorder = 1;
  p->fVeryVerbose = 0;
  p->TimeLimit = 0;
  p->TimeTarget = 0;
  p->fIndConstr = 0;
  p->fUsePivots = 0;
  p->fCluster = 0;
  p->fSchedule = 0;
  p->iFrame = -1;
  return;
}

Assistant:

void Llb_BddSetDefaultParams( Gia_ParLlb_t * p )
{
    memset( p, 0, sizeof(Gia_ParLlb_t) );
    p->nBddMax       =  1000000;
    p->nIterMax      = 10000000;
    p->nClusterMax   =       20;
    p->nHintDepth    =        0;
    p->HintFirst     =        0;
    p->fUseFlow      =        0;  // use flow 
    p->nVolumeMax    =      100;  // max volume
    p->nVolumeMin    =       30;  // min volume
    p->fReorder      =        1;
    p->fIndConstr    =        0;
    p->fUsePivots    =        0;
    p->fCluster      =        0;
    p->fSchedule     =        0;
    p->fVerbose      =        0;
    p->fVeryVerbose  =        0;
    p->fSilent       =        0;
    p->TimeLimit     =        0;
//    p->TimeLimit     =        0;
    p->TimeLimitGlo  =        0;
    p->TimeTarget    =        0;
    p->iFrame        =       -1;
}